

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O0

void __thiscall CLayers::InitTilemapSkip(CLayers *this)

{
  int iVar1;
  CMapItemGroup *pCVar2;
  CMapItemLayer *pCVar3;
  IMap *pIVar4;
  undefined4 extraout_var;
  CLayers *in_RDI;
  int SkippedX;
  int x;
  int y;
  CTile *pTiles;
  CMapItemLayerTilemap *pTilemap;
  CMapItemLayer *pLayer;
  int l;
  CMapItemGroup *pGroup;
  int g;
  int Index;
  int local_44;
  int local_40;
  int local_3c;
  int local_1c;
  int local_c;
  
  local_c = 0;
  while (Index = local_c, iVar1 = NumGroups(in_RDI), Index < iVar1) {
    pCVar2 = GetGroup(in_RDI,Index);
    for (local_1c = 0; local_1c < (pCVar2->super_CMapItemGroup_v1).m_NumLayers;
        local_1c = local_1c + 1) {
      pCVar3 = GetLayer(in_RDI,Index);
      if (pCVar3->m_Type == 2) {
        pIVar4 = Map(in_RDI);
        iVar1 = (*(pIVar4->super_IInterface)._vptr_IInterface[2])
                          (pIVar4,(ulong)(uint)pCVar3[4].m_Flags);
        for (local_3c = 0; local_3c < pCVar3[1].m_Flags; local_3c = local_3c + 1) {
          for (local_40 = 1; local_40 < pCVar3[1].m_Type; local_40 = local_44 + local_40) {
            local_44 = 1;
            while ((local_40 + local_44 < pCVar3[1].m_Type && local_44 < 0xff &&
                   (*(char *)(CONCAT44(extraout_var,iVar1) +
                             (long)(local_3c * pCVar3[1].m_Type + local_40 + local_44) * 4) == '\0')
                   )) {
              local_44 = local_44 + 1;
            }
            *(char *)(CONCAT44(extraout_var,iVar1) + 2 +
                     (long)(local_3c * pCVar3[1].m_Type + local_40) * 4) = (char)local_44 + -1;
          }
        }
      }
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void CLayers::InitTilemapSkip()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = (CMapItemLayerTilemap *)pLayer;
				CTile *pTiles = (CTile *)Map()->GetData(pTilemap->m_Data);
				for(int y = 0; y < pTilemap->m_Height; y++)
				{
					for(int x = 1; x < pTilemap->m_Width;)
					{
						int SkippedX;
						for(SkippedX = 1; x+SkippedX < pTilemap->m_Width && SkippedX < 255; SkippedX++)
						{
							if(pTiles[y*pTilemap->m_Width+x+SkippedX].m_Index)
								break;
						}

						pTiles[y*pTilemap->m_Width+x].m_Skip = SkippedX-1;
						x += SkippedX;
					}
				}
			}
		}
	}
}